

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

void __thiscall UdpSocketImpl::~UdpSocketImpl(UdpSocketImpl *this)

{
  bool bVar1;
  bool bIsLocked;
  UdpSocketImpl *this_local;
  
  (this->super_BaseSocketImpl)._vptr_BaseSocketImpl = (_func_int **)&PTR__UdpSocketImpl_001b9550;
  (this->super_BaseSocketImpl).m_bStop = true;
  bVar1 = std::mutex::try_lock(&this->m_mxWrite);
  this->m_bCloseReq = true;
  std::__atomic_base<unsigned_long>::operator=
            (&(this->m_atOutBytes).super___atomic_base<unsigned_long>,0);
  std::condition_variable::notify_all();
  if (bVar1) {
    std::mutex::unlock(&this->m_mxWrite);
  }
  if ((this->super_BaseSocketImpl).m_fSock != -1) {
    close((this->super_BaseSocketImpl).m_fSock);
    bVar1 = std::function::operator_cast_to_bool
                      ((function *)&(this->super_BaseSocketImpl).m_fClosingParam);
    if (bVar1) {
      std::function<void_(BaseSocket_*,_void_*)>::operator()
                (&(this->super_BaseSocketImpl).m_fClosingParam,(this->super_BaseSocketImpl).m_pBkRef
                 ,(this->super_BaseSocketImpl).m_pvUserData);
    }
    else {
      bVar1 = std::function::operator_cast_to_bool
                        ((function *)&(this->super_BaseSocketImpl).m_fClosing);
      if (bVar1) {
        std::function<void_(BaseSocket_*)>::operator()
                  (&(this->super_BaseSocketImpl).m_fClosing,(this->super_BaseSocketImpl).m_pBkRef);
      }
    }
  }
  std::function<void_(UdpSocket_*,_void_*)>::~function(&this->m_fBytesReceivedParam);
  std::function<void_(UdpSocket_*)>::~function(&this->m_fBytesReceived);
  std::condition_variable::~condition_variable(&this->m_cv);
  std::
  deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~deque(&this->m_quOutData);
  std::
  function<int_(const_unsigned_char_*,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&this->m_fnSslEncode);
  std::
  deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~deque(&this->m_quInData);
  std::
  function<int_(const_unsigned_char_*,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&this->m_fnSslDecode);
  BaseSocketImpl::~BaseSocketImpl(&this->super_BaseSocketImpl);
  return;
}

Assistant:

UdpSocketImpl::~UdpSocketImpl()
{
    m_bStop = true; // Stops the listening thread
    const bool bIsLocked = m_mxWrite.try_lock();
    m_bCloseReq = true;
    m_atOutBytes = 0;
    m_cv.notify_all();
    if (bIsLocked == true)
        m_mxWrite.unlock();

    if (m_fSock != INVALID_SOCKET)
    {
        ::closesocket(m_fSock);

        if (m_fClosingParam)
            m_fClosingParam(m_pBkRef, m_pvUserData);
        else if (m_fClosing)
            m_fClosing(m_pBkRef);
    }
}